

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_astar.hpp
# Opt level: O1

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
compress::CompressAstar<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          CompressAstar<Tiles> *this,State *init)

{
  CompressClosedList<Node<Tiles>_> *this_00;
  size_t *psVar1;
  CompressOpenList<Node<Tiles>_> *this_01;
  pointer *ppSVar2;
  char cVar3;
  int iVar4;
  iterator iVar5;
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *pvVar9;
  pair<bool,_bool> pVar10;
  int i;
  long lVar11;
  Tiles *pTVar12;
  char cVar13;
  long lVar14;
  vector<Tiles::State,std::allocator<Tiles::State>> *this_02;
  State state;
  Node<Tiles> n;
  Node<Tiles> parent;
  State parent_state;
  State local_9a;
  Node<Tiles> local_88;
  Node<Tiles> local_70;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *local_58;
  vector<Tiles::State,std::allocator<Tiles::State>> *local_50;
  State local_42;
  
  uVar8 = local_88._0_8_;
  lVar11 = 0;
  local_88.g = '\0';
  local_88.f = init->h;
  local_88._3_5_ = SUB85(uVar8,3);
  local_88.pop = -1;
  init->tiles[init->blank] = '\0';
  local_88.parent_packed.word = 0;
  do {
    local_88.parent_packed.word = (long)init->tiles[lVar11] | local_88.parent_packed.word << 4;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10);
  this_01 = &this->open;
  local_88.packed.word = local_88.parent_packed.word;
  local_58 = __return_storage_ptr__;
  CompressOpenList<Node<Tiles>_>::push(this_01,&local_88);
  this_02 = (vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path;
  if (((this->open).size != 0) &&
     ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    this_00 = &this->closed;
    local_50 = this_02;
    do {
      CompressOpenList<Node<Tiles>_>::pop(&local_88,this_01);
      pVar10 = CompressClosedList<Node<Tiles>_>::find_insert(this_00,&local_88);
      if (((ushort)pVar10 & 1) == 0) {
LAB_0010793f:
        Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_9a,local_88.packed);
        cVar6 = local_9a.h;
        if (local_9a.h == '\0') {
          iVar5._M_current =
               (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Tiles::State,std::allocator<Tiles::State>>::
            _M_realloc_insert<Tiles::State_const&>(this_02,iVar5,&local_9a);
          }
          else {
            (iVar5._M_current)->blank = local_9a.blank;
            (iVar5._M_current)->h = local_9a.h;
            *(undefined8 *)(iVar5._M_current)->tiles = local_9a.tiles._0_8_;
            *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_9a.tiles._8_8_;
            ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
          while (local_88.packed.word != local_88.parent_packed.word) {
            CompressClosedList<Node<Tiles>_>::trace_parent(&local_70,this_00,&local_88);
            Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_42,local_70.packed);
            iVar5._M_current =
                 (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<Tiles::State,std::allocator<Tiles::State>>::
              _M_realloc_insert<Tiles::State_const&>(this_02,iVar5,&local_42);
            }
            else {
              (iVar5._M_current)->blank = local_42.blank;
              (iVar5._M_current)->h = local_42.h;
              *(undefined8 *)(iVar5._M_current)->tiles = local_42.tiles._0_8_;
              *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_42.tiles._8_8_;
              ppSVar2 = &(this->path).
                         super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppSVar2 = *ppSVar2 + 1;
            }
            local_88.g = local_70.g;
            local_88.f = local_70.f;
            local_88.pop = local_70.pop;
            local_88._3_5_ = local_70._3_5_;
            local_88.parent_packed.word = local_70.parent_packed.word;
            local_88.packed.word = local_70.packed.word;
          }
          CompressClosedList<Node<Tiles>_>::print_statistics(this_00);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
          ::clear((_Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
                   *)this_01);
          (this->open).size = 0;
          rmdir("open_list_buckets");
          CompressClosedList<Node<Tiles>_>::clear(this_00);
        }
        else {
          psVar1 = &(this->super_SearchAlg<Tiles>).expd;
          *psVar1 = *psVar1 + 1;
          pTVar12 = (this->super_SearchAlg<Tiles>).dom;
          lVar11 = (long)local_9a.blank;
          if (0 < *(int *)(pTVar12 + lVar11 * 0x14 + 0x4440)) {
            lVar14 = 0;
            cVar13 = local_9a.blank;
            do {
              iVar4 = *(int *)(pTVar12 + lVar14 * 4 + lVar11 * 0x14 + 0x4444);
              if (iVar4 != local_88.pop) {
                psVar1 = &(this->super_SearchAlg<Tiles>).gend;
                *psVar1 = *psVar1 + 1;
                cVar7 = local_9a.h;
                cVar3 = local_9a.tiles[iVar4];
                local_9a.tiles[lVar11] = cVar3;
                local_9a.h = local_9a.h +
                             (char)pTVar12[(long)local_9a.blank * 4 +
                                           (long)cVar3 * 0x400 + (long)iVar4 * 0x40 + 0x440];
                local_9a.blank = (char)iVar4;
                local_70.g = local_88.g + '\x01';
                local_70.f = local_88.g + '\x01' + local_9a.h;
                local_70.pop = cVar13;
                local_70.packed.word = 0;
                local_9a.tiles[(char)iVar4] = '\0';
                lVar11 = 0;
                local_70.packed.word = 0;
                do {
                  local_70.packed.word = (long)local_9a.tiles[lVar11] | local_70.packed.word << 4;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 0x10);
                local_70.parent_packed.word = local_88.packed.word;
                CompressOpenList<Node<Tiles>_>::push(this_01,&local_70);
                local_9a.h = cVar7;
                local_9a.tiles[local_9a.blank] = local_9a.tiles[cVar13];
                local_9a.blank = cVar13;
              }
              lVar14 = lVar14 + 1;
              pTVar12 = (this->super_SearchAlg<Tiles>).dom;
              lVar11 = (long)local_9a.blank;
              cVar13 = local_9a.blank;
            } while (lVar14 < *(int *)(pTVar12 + lVar11 * 0x14 + 0x4440));
          }
        }
        this_02 = local_50;
        if (cVar6 == '\0') break;
      }
      else {
        if (((ushort)pVar10 >> 8 & 1) != 0) {
          psVar1 = &(this->super_SearchAlg<Tiles>).reopd;
          *psVar1 = *psVar1 + 1;
        }
        if ((((ushort)pVar10 & 1) == 0) || (((ushort)pVar10 & 0x100) != 0)) goto LAB_0010793f;
      }
      if (((this->open).size == 0) ||
         ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
          super__Vector_impl_data._M_start)) break;
    } while( true );
  }
  pvVar9 = local_58;
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            (local_58,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)this_02);
  return pvVar9;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                Node<D> n = open.pop();

                bool found, reopened;
                tie(found, reopened) = closed.find_insert(n);
                if (found && reopened) this->reopd++;
                if (found && !reopened) continue;

                typename D::State state;
                this->dom.unpack(state, n.packed);

                if (this->dom.isgoal(state)) {
                    // trace path here
                    path.push_back(state);
                    while(n.packed != n.parent_packed) {
                        Node<D> parent = closed.trace_parent(n);
                        typename D::State parent_state;
                        this->dom.unpack(parent_state, parent.packed);
                        path.push_back(parent_state);
                        n = parent;
                    }
                    closed.print_statistics();
                    open.clear();
                    closed.clear();
                    break;
                }

                this->expd++;
                for (int i = 0; i < this->dom.nops(state); i++) {
                    int op = this->dom.nthop(state, i);
                    if (op == n.pop)
                        continue;
                    this->gend++;
                    Edge<D> e = this->dom.apply(state, op);
                    open.push(wrap(state, &n, e.cost, e.pop));
                    this->dom.undo(state, e);
                }
            }
            return path;
        }